

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::matcher<(anonymous_namespace)::yaml_output>::set_error
          (matcher<(anonymous_namespace)::yaml_output> *this,
          parser<(anonymous_namespace)::yaml_output> *parser,error_code *err)

{
  bool bVar1;
  error_code err_00;
  bool has_error;
  error_code *err_local;
  parser<(anonymous_namespace)::yaml_output> *parser_local;
  matcher<(anonymous_namespace)::yaml_output> *this_local;
  
  err_00._0_8_ = *(ulong *)err & 0xffffffff;
  err_00._M_cat = err->_M_cat;
  bVar1 = parser<(anonymous_namespace)::yaml_output>::set_error(parser,err_00);
  if (bVar1) {
    set_state(this,1);
  }
  return bVar1;
}

Assistant:

bool set_error (parser<Callbacks> & parser, std::error_code const & err) noexcept {
                    bool const has_error = parser.set_error (err);
                    if (has_error) {
                        set_state (done);
                    }
                    return has_error;
                }